

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O1

OPJ_UINT32 opj_get_encoding_packet_count(opj_image_t *p_image,opj_cp_t *p_cp,OPJ_UINT32 p_tile_no)

{
  OPJ_UINT32 l_dy_min;
  OPJ_UINT32 l_dx_min;
  OPJ_UINT32 l_ty1;
  OPJ_UINT32 l_ty0;
  OPJ_UINT32 l_tx1;
  OPJ_UINT32 l_tx0;
  OPJ_UINT32 l_max_prec;
  OPJ_UINT32 l_max_res;
  
  if (p_cp == (opj_cp_t *)0x0) {
    __assert_fail("p_cp != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/pi.c"
                  ,0x642,
                  "OPJ_UINT32 opj_get_encoding_packet_count(const opj_image_t *, const opj_cp_t *, OPJ_UINT32)"
                 );
  }
  if (p_image != (opj_image_t *)0x0) {
    if (p_tile_no < p_cp->th * p_cp->tw) {
      opj_get_all_encoding_parameters
                (p_image,p_cp,p_tile_no,&l_tx0,&l_tx1,&l_ty0,&l_ty1,&l_dx_min,&l_dy_min,&l_max_prec,
                 &l_max_res,(OPJ_UINT32 **)0x0);
      return l_max_prec * p_cp->tcps[p_tile_no].numlayers * p_image->numcomps * l_max_res;
    }
    __assert_fail("p_tile_no < p_cp->tw * p_cp->th",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/pi.c"
                  ,0x644,
                  "OPJ_UINT32 opj_get_encoding_packet_count(const opj_image_t *, const opj_cp_t *, OPJ_UINT32)"
                 );
  }
  __assert_fail("p_image != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/pi.c"
                ,0x643,
                "OPJ_UINT32 opj_get_encoding_packet_count(const opj_image_t *, const opj_cp_t *, OPJ_UINT32)"
               );
}

Assistant:

OPJ_UINT32 opj_get_encoding_packet_count(const opj_image_t *p_image,
        const opj_cp_t *p_cp,
        OPJ_UINT32 p_tile_no)
{
    OPJ_UINT32 l_max_res;
    OPJ_UINT32 l_max_prec;
    OPJ_UINT32 l_tx0, l_tx1, l_ty0, l_ty1;
    OPJ_UINT32 l_dx_min, l_dy_min;

    /* preconditions in debug*/
    assert(p_cp != 00);
    assert(p_image != 00);
    assert(p_tile_no < p_cp->tw * p_cp->th);

    /* get encoding parameters*/
    opj_get_all_encoding_parameters(p_image, p_cp, p_tile_no, &l_tx0, &l_tx1,
                                    &l_ty0, &l_ty1, &l_dx_min, &l_dy_min, &l_max_prec, &l_max_res, NULL);

    return p_cp->tcps[p_tile_no].numlayers * l_max_prec * p_image->numcomps *
           l_max_res;
}